

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::protobuf_ShutdownFile_google_2fprotobuf_2fdescriptor_2eproto(void)

{
  if (FileDescriptorSet::default_instance_ != (long *)0x0) {
    (**(code **)(*FileDescriptorSet::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::FileDescriptorSet_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::FileDescriptorSet_reflection_ + 8))();
  }
  if (FileDescriptorProto::default_instance_ != (long *)0x0) {
    (**(code **)(*FileDescriptorProto::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::FileDescriptorProto_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::FileDescriptorProto_reflection_ + 8))();
  }
  if (DescriptorProto::default_instance_ != (long *)0x0) {
    (**(code **)(*DescriptorProto::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::DescriptorProto_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::DescriptorProto_reflection_ + 8))();
  }
  if (DescriptorProto_ExtensionRange::default_instance_ != (long *)0x0) {
    (**(code **)(*DescriptorProto_ExtensionRange::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::DescriptorProto_ExtensionRange_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::DescriptorProto_ExtensionRange_reflection_ + 8))();
  }
  if (FieldDescriptorProto::default_instance_ != (long *)0x0) {
    (**(code **)(*FieldDescriptorProto::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::FieldDescriptorProto_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::FieldDescriptorProto_reflection_ + 8))();
  }
  if (EnumDescriptorProto::default_instance_ != (long *)0x0) {
    (**(code **)(*EnumDescriptorProto::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::EnumDescriptorProto_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::EnumDescriptorProto_reflection_ + 8))();
  }
  if (EnumValueDescriptorProto::default_instance_ != (long *)0x0) {
    (**(code **)(*EnumValueDescriptorProto::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::EnumValueDescriptorProto_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::EnumValueDescriptorProto_reflection_ + 8))();
  }
  if (ServiceDescriptorProto::default_instance_ != (long *)0x0) {
    (**(code **)(*ServiceDescriptorProto::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::ServiceDescriptorProto_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::ServiceDescriptorProto_reflection_ + 8))();
  }
  if (MethodDescriptorProto::default_instance_ != (long *)0x0) {
    (**(code **)(*MethodDescriptorProto::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::MethodDescriptorProto_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::MethodDescriptorProto_reflection_ + 8))();
  }
  if (FileOptions::default_instance_ != (long *)0x0) {
    (**(code **)(*FileOptions::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::FileOptions_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::FileOptions_reflection_ + 8))();
  }
  if (MessageOptions::default_instance_ != (long *)0x0) {
    (**(code **)(*MessageOptions::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::MessageOptions_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::MessageOptions_reflection_ + 8))();
  }
  if (FieldOptions::default_instance_ != (long *)0x0) {
    (**(code **)(*FieldOptions::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::FieldOptions_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::FieldOptions_reflection_ + 8))();
  }
  if (EnumOptions::default_instance_ != (long *)0x0) {
    (**(code **)(*EnumOptions::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::EnumOptions_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::EnumOptions_reflection_ + 8))();
  }
  if (EnumValueOptions::default_instance_ != (long *)0x0) {
    (**(code **)(*EnumValueOptions::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::EnumValueOptions_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::EnumValueOptions_reflection_ + 8))();
  }
  if (ServiceOptions::default_instance_ != (long *)0x0) {
    (**(code **)(*ServiceOptions::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::ServiceOptions_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::ServiceOptions_reflection_ + 8))();
  }
  if (MethodOptions::default_instance_ != (long *)0x0) {
    (**(code **)(*MethodOptions::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::MethodOptions_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::MethodOptions_reflection_ + 8))();
  }
  if (UninterpretedOption::default_instance_ != (long *)0x0) {
    (**(code **)(*UninterpretedOption::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::UninterpretedOption_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::UninterpretedOption_reflection_ + 8))();
  }
  if (UninterpretedOption_NamePart::default_instance_ != (long *)0x0) {
    (**(code **)(*UninterpretedOption_NamePart::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::UninterpretedOption_NamePart_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::UninterpretedOption_NamePart_reflection_ + 8))();
  }
  if (SourceCodeInfo::default_instance_ != (long *)0x0) {
    (**(code **)(*SourceCodeInfo::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::SourceCodeInfo_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::SourceCodeInfo_reflection_ + 8))();
  }
  if (SourceCodeInfo_Location::default_instance_ != (long *)0x0) {
    (**(code **)(*SourceCodeInfo_Location::default_instance_ + 8))();
  }
  if ((anonymous_namespace)::SourceCodeInfo_Location_reflection_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::SourceCodeInfo_Location_reflection_ + 8))();
    return;
  }
  return;
}

Assistant:

void protobuf_ShutdownFile_google_2fprotobuf_2fdescriptor_2eproto() {
  delete FileDescriptorSet::default_instance_;
  delete FileDescriptorSet_reflection_;
  delete FileDescriptorProto::default_instance_;
  delete FileDescriptorProto_reflection_;
  delete DescriptorProto::default_instance_;
  delete DescriptorProto_reflection_;
  delete DescriptorProto_ExtensionRange::default_instance_;
  delete DescriptorProto_ExtensionRange_reflection_;
  delete FieldDescriptorProto::default_instance_;
  delete FieldDescriptorProto_reflection_;
  delete EnumDescriptorProto::default_instance_;
  delete EnumDescriptorProto_reflection_;
  delete EnumValueDescriptorProto::default_instance_;
  delete EnumValueDescriptorProto_reflection_;
  delete ServiceDescriptorProto::default_instance_;
  delete ServiceDescriptorProto_reflection_;
  delete MethodDescriptorProto::default_instance_;
  delete MethodDescriptorProto_reflection_;
  delete FileOptions::default_instance_;
  delete FileOptions_reflection_;
  delete MessageOptions::default_instance_;
  delete MessageOptions_reflection_;
  delete FieldOptions::default_instance_;
  delete FieldOptions_reflection_;
  delete EnumOptions::default_instance_;
  delete EnumOptions_reflection_;
  delete EnumValueOptions::default_instance_;
  delete EnumValueOptions_reflection_;
  delete ServiceOptions::default_instance_;
  delete ServiceOptions_reflection_;
  delete MethodOptions::default_instance_;
  delete MethodOptions_reflection_;
  delete UninterpretedOption::default_instance_;
  delete UninterpretedOption_reflection_;
  delete UninterpretedOption_NamePart::default_instance_;
  delete UninterpretedOption_NamePart_reflection_;
  delete SourceCodeInfo::default_instance_;
  delete SourceCodeInfo_reflection_;
  delete SourceCodeInfo_Location::default_instance_;
  delete SourceCodeInfo_Location_reflection_;
}